

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

void ImDrawList_AddQuad(ImDrawList *self,ImVec2 a,ImVec2 b,ImVec2 c,ImVec2 d,ImU32 col,
                       float thickness)

{
  float thickness_local;
  ImU32 col_local;
  ImDrawList *self_local;
  ImVec2 d_local;
  ImVec2 c_local;
  ImVec2 b_local;
  ImVec2 a_local;
  
  self_local = (ImDrawList *)d;
  d_local = c;
  c_local = b;
  b_local = a;
  ImDrawList::AddQuad(self,&b_local,&c_local,&d_local,(ImVec2 *)&self_local,col,thickness);
  return;
}

Assistant:

CIMGUI_API void _ImDrawList_AddQuad (ImDrawList *larg1, ImVec2 const *larg2, ImVec2 const *larg3, ImVec2 const *larg4, ImVec2 const *larg5, ImU32 *larg6, float larg7) {
  ImDrawList *arg1 = (ImDrawList *) 0 ;
  ImVec2 arg2 ;
  ImVec2 arg3 ;
  ImVec2 arg4 ;
  ImVec2 arg5 ;
  ImU32 arg6 ;
  float arg7 ;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = *larg3;
  arg4 = *larg4;
  arg5 = *larg5;
  arg6 = *larg6;
  arg7 = larg7;
  try {
    ImDrawList_AddQuad(arg1,arg2,arg3,arg4,arg5,arg6,arg7);
    
  } catch (...) {
    
  }
}